

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu540c_common.c
# Opt level: O2

MPP_RET vepu540c_set_roi(void *roi_reg_base,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  short sVar1;
  MppEncROIRegion *pMVar2;
  byte bVar3;
  int iVar4;
  undefined4 in_register_0000000c;
  int iVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  pMVar2 = roi->regions;
  *(undefined8 *)((long)roi_reg_base + 0x80) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x88) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x70) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x78) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x60) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x68) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x50) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x58) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x40) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x48) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x30) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x38) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x20) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x28) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x10) = 0;
  *(undefined8 *)((long)roi_reg_base + 0x18) = 0;
  if (roi_reg_base == (void *)0x0 || roi == (MppEncROICfg *)0x0) {
    _mpp_log_l(2,"vepu540c_common","invalid buf %p roi %p\n","vepu540c_set_roi",roi_reg_base);
  }
  else {
    uVar6 = roi->number;
    if (uVar6 < 9) {
      lVar8 = 0;
      iVar5 = 0;
      do {
        if ((int)uVar6 <= iVar5) {
          return MPP_OK;
        }
        uVar6 = (uint)*(ushort *)((long)&pMVar2->x + lVar8);
        if ((w < (int)(*(ushort *)((long)&pMVar2->w + lVar8) + uVar6)) ||
           (iVar4 = 0,
           h < (int)((uint)*(ushort *)((long)&pMVar2->h + lVar8) +
                    (uint)*(ushort *)((long)&pMVar2->y + lVar8)))) {
          iVar4 = -1;
        }
        if ((((1 < *(ushort *)((long)&pMVar2->intra + lVar8)) ||
             (7 < *(ushort *)((long)&pMVar2->qp_area_idx + lVar8))) ||
            (1 < (&pMVar2->area_map_en)[lVar8])) || (bVar3 = (&pMVar2->abs_qp_en)[lVar8], 1 < bVar3)
           ) {
          bVar3 = (&pMVar2->abs_qp_en)[lVar8];
          iVar4 = -1;
        }
        sVar1 = *(short *)((long)&pMVar2->quality + lVar8);
        if (bVar3 == 0) {
          if ((iVar4 != 0) || (0x66 < (ushort)(sVar1 + 0x33U))) {
LAB_00255aa5:
            _mpp_log_l(2,"vepu540c_common","region %d invalid param:\n","vepu540c_set_roi");
            _mpp_log_l(2,"vepu540c_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu540c_set_roi",
                       (ulong)*(ushort *)((long)&pMVar2->x + lVar8),
                       (ulong)*(ushort *)((long)&pMVar2->y + lVar8),
                       (ulong)*(ushort *)((long)&pMVar2->w + lVar8),
                       (ulong)*(ushort *)((long)&pMVar2->h + lVar8),(ulong)(uint)w,
                       CONCAT44(in_register_0000000c,h));
            _mpp_log_l(2,"vepu540c_common","force intra %d qp area index %d\n","vepu540c_set_roi",
                       (ulong)*(ushort *)((long)&pMVar2->intra + lVar8),
                       (ulong)*(ushort *)((long)&pMVar2->qp_area_idx + lVar8));
            _mpp_log_l(2,"vepu540c_common","abs qp mode %d value %d\n","vepu540c_set_roi",
                       (ulong)(&pMVar2->abs_qp_en)[lVar8],
                       (ulong)(uint)(int)*(short *)((long)&pMVar2->quality + lVar8));
            return MPP_NOK;
          }
        }
        else if ((iVar4 != 0) || (0x33 < sVar1)) goto LAB_00255aa5;
        uVar7 = uVar6 + 0xf >> 4 & 0x3ff;
        uVar6 = *(uint *)((long)roi_reg_base + lVar8 + 0x10);
        *(uint *)((long)roi_reg_base + lVar8 + 0x10) = uVar6 & 0xfffffc00 | uVar7;
        *(uint *)((long)roi_reg_base + lVar8 + 0x10) =
             uVar6 & 0xfc00fc00 | uVar7 |
             (uint)*(ushort *)((long)&pMVar2->y + lVar8) * 0x1000 + 0xf000 & 0x3ff0000;
        uVar7 = (uint)*(ushort *)((long)&pMVar2->x + lVar8) +
                (uint)*(ushort *)((long)&pMVar2->w + lVar8) + 0xf >> 4 & 0x3ff;
        uVar6 = *(uint *)((long)roi_reg_base + lVar8 + 0x14);
        *(uint *)((long)roi_reg_base + lVar8 + 0x14) = uVar6 & 0xfffffc00 | uVar7;
        *(uint *)((long)roi_reg_base + lVar8 + 0x14) =
             uVar6 & 0xfc00fc00 | uVar7 |
             ((uint)*(ushort *)((long)&pMVar2->h + lVar8) +
             (uint)*(ushort *)((long)&pMVar2->y + lVar8)) * 0x1000 + 0xf000 & 0x3ff0000;
        uVar6 = *(uint *)((long)roi_reg_base + lVar8 + 0x18);
        uVar7 = *(ushort *)((long)&pMVar2->quality + lVar8) & 0x7f;
        *(uint *)((long)roi_reg_base + lVar8 + 0x18) = uVar6 & 0xffffff80 | uVar7;
        *(uint *)((long)roi_reg_base + lVar8 + 0x18) =
             (uint)(byte)((&pMVar2->abs_qp_en)[lVar8] << 7) + (uVar6 & 0xffffc000 | uVar7) + 0x3f00;
        if (*(short *)((long)&pMVar2->intra + lVar8) != 0) {
          *(uint *)((long)roi_reg_base + lVar8 + 0x1c) =
               *(uint *)((long)roi_reg_base + lVar8 + 0x1c) & 0xff0ff0ff | 0x100100;
        }
        iVar5 = iVar5 + 1;
        uVar6 = roi->number;
        lVar8 = lVar8 + 0x10;
      } while( true );
    }
    _mpp_log_l(2,"vepu540c_common","invalid region number %d\n","vepu540c_set_roi",(ulong)uVar6);
  }
  return MPP_NOK;
}

Assistant:

MPP_RET vepu540c_set_roi(void *roi_reg_base, MppEncROICfg * roi,
                         RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu540cRoiCfg  *roi_cfg = (Vepu540cRoiCfg *)roi_reg_base;
    Vepu540cRoiRegion *reg_regions = &roi_cfg->regions[0];
    MPP_RET ret = MPP_NOK;
    RK_S32 i = 0;
    memset(reg_regions, 0, sizeof(Vepu540cRoiRegion) * 8);
    if (NULL == roi_cfg || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", roi_cfg, roi);
        goto DONE;
    }

    if (roi->number > VEPU540C_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32) roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1
            || region->qp_area_idx >= VEPU541_MAX_ROI_NUM
            || region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en
             && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w,
                      h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
        reg_regions->roi_pos_lt.roi_lt_x = MPP_ALIGN(region->x, 16) >> 4;
        reg_regions->roi_pos_lt.roi_lt_y = MPP_ALIGN(region->y, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_x = MPP_ALIGN(region->x + region->w, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_y = MPP_ALIGN(region->y + region->h, 16) >> 4;
        reg_regions->roi_base.roi_qp_value = region->quality;
        reg_regions->roi_base.roi_qp_adj_mode = region->abs_qp_en;
        reg_regions->roi_base.roi_en = 1;
        reg_regions->roi_base.roi_pri = 0x1f;
        if (region->intra) {
            reg_regions->roi_mdc.roi_mdc_intra16 = 1;
            reg_regions->roi_mdc.roi0_mdc_intra32_hevc = 1;
        }
        reg_regions++;
    }

DONE:
    return ret;
}